

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionJITTimeInfo.cpp
# Opt level: O0

void FunctionJITTimeInfo::BuildJITTimeData
               (ArenaAllocator *alloc,FunctionCodeGenJitTimeData *codeGenData,
               FunctionCodeGenRuntimeData *runtimeData,FunctionJITTimeDataIDL *jitData,
               bool isInlinee,bool isForegroundJIT)

{
  code *pcVar1;
  FunctionCodeGenJitTimeData *pFVar2;
  bool bVar3;
  LocalFunctionId LVar4;
  uint uVar5;
  BOOL BVar6;
  uint uVar7;
  FunctionInfo *pFVar8;
  RecyclerWeakReference<Js::FunctionBody> *pRVar9;
  BVFixed **ppBVar10;
  EntryPointInfo *pEVar11;
  FunctionBody *pFVar12;
  ByteBlock *pBVar13;
  undefined4 *puVar14;
  ParseableFunctionInfo *this;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar15;
  FunctionBodyDataIDL *pFVar16;
  DynamicProfileInfo *profileInfo;
  int **ppiVar17;
  FunctionJITTimeDataIDL **ppFVar18;
  uchar *puVar19;
  FunctionJITTimeDataIDL *pFVar20;
  FunctionJITRuntimeIDL *pFVar21;
  InlineCachePointerArray<Js::InlineCache> *pIVar22;
  long *plVar23;
  InlineCache *pIVar24;
  ObjTypeSpecFldInfoArray *this_00;
  ObjTypeSpecFldIDL **ppOVar25;
  FunctionCodeGenRuntimeData *local_518;
  FunctionCodeGenRuntimeData *local_4d0;
  FunctionCodeGenRuntimeData *local_4a8;
  FunctionCodeGenRuntimeData *local_480;
  TrackAllocData local_3e0;
  FunctionCodeGenJitTimeData *local_3b8;
  FunctionCodeGenJitTimeData *nextJITData;
  Type *globObjTypeSpecInfo;
  undefined8 local_3a0;
  TrackAllocData local_398;
  FunctionCodeGenRuntimeData *local_370;
  FunctionCodeGenRuntimeData *inlineeRuntimeData_3;
  FunctionCodeGenJitTimeData *inlineeJITData_3;
  Type *pTStack_358;
  InlineCacheIndex i_3;
  Type *objTypeSpecInfo;
  undefined8 local_348;
  TrackAllocData local_340;
  uint local_314;
  code *pcStack_310;
  uint j;
  undefined8 local_308;
  TrackAllocData local_300;
  code *local_2d8;
  undefined8 local_2d0;
  TrackAllocData local_2c8;
  code *local_2a0;
  undefined8 local_298;
  TrackAllocData local_290;
  FunctionCodeGenRuntimeData *local_268;
  FunctionCodeGenRuntimeData *inlineeRuntimeData_2;
  FunctionCodeGenJitTimeData *inlineeJITData_2;
  code *pcStack_250;
  ProfileId i_2;
  undefined8 local_248;
  TrackAllocData local_240;
  code *local_218;
  undefined8 local_210;
  TrackAllocData local_208;
  FunctionCodeGenRuntimeData *local_1e0;
  FunctionCodeGenRuntimeData *inlineeRuntimeData_1;
  FunctionCodeGenJitTimeData *inlineeJITData_1;
  code *pcStack_1c8;
  ProfileId i_1;
  undefined8 local_1c0;
  TrackAllocData local_1b8;
  code *local_190;
  undefined8 local_188;
  TrackAllocData local_180;
  FunctionCodeGenRuntimeData *local_158;
  FunctionCodeGenRuntimeData *inlineeRuntimeData;
  FunctionCodeGenJitTimeData *inlineeJITData;
  code *pcStack_140;
  ProfileId i;
  undefined8 local_138;
  TrackAllocData local_130;
  code *local_108;
  undefined8 local_100;
  TrackAllocData local_f8;
  FunctionEntryPointInfo *local_d0;
  FunctionEntryPointInfo *functionEntryPointInfo;
  ProxyEntryPointInfo *defaultEntryPointInfo;
  undefined8 local_b8;
  TrackAllocData local_b0;
  ProfileDataIDL *local_88;
  ProfileDataIDL *profileData;
  FunctionBody *functionBody;
  FunctionCodeGenRuntimeData *targetRuntimeData;
  undefined8 local_68;
  TrackAllocData local_60;
  FunctionBody *local_38;
  FunctionBody *body;
  bool isForegroundJIT_local;
  FunctionJITTimeDataIDL *pFStack_28;
  bool isInlinee_local;
  FunctionJITTimeDataIDL *jitData_local;
  FunctionCodeGenRuntimeData *runtimeData_local;
  FunctionCodeGenJitTimeData *codeGenData_local;
  ArenaAllocator *alloc_local;
  
  body._6_1_ = isForegroundJIT;
  body._7_1_ = isInlinee;
  pFStack_28 = jitData;
  jitData_local = (FunctionJITTimeDataIDL *)runtimeData;
  runtimeData_local = (FunctionCodeGenRuntimeData *)codeGenData;
  codeGenData_local = (FunctionCodeGenJitTimeData *)alloc;
  pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(codeGenData);
  pFStack_28->functionInfoAddr = (long)pFVar8;
  pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo
                     ((FunctionCodeGenJitTimeData *)runtimeData_local);
  LVar4 = Js::FunctionInfo::GetLocalFunctionId(pFVar8);
  pFStack_28->localFuncId = LVar4;
  bVar3 = Js::FunctionCodeGenJitTimeData::GetIsAggressiveInliningEnabled
                    ((FunctionCodeGenJitTimeData *)runtimeData_local);
  pFStack_28->isAggressiveInliningEnabled = bVar3;
  bVar3 = Js::FunctionCodeGenJitTimeData::GetIsInlined
                    ((FunctionCodeGenJitTimeData *)runtimeData_local);
  pFStack_28->isInlined = bVar3;
  pRVar9 = Js::FunctionCodeGenJitTimeData::GetWeakFuncRef
                     ((FunctionCodeGenJitTimeData *)runtimeData_local);
  pFStack_28->weakFuncRef = (long)pRVar9;
  ppBVar10 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                       ((WriteBarrierPtr *)&runtimeData_local[2].inlinees);
  pFStack_28->inlineesBv = (BVFixedIDL *)*ppBVar10;
  pEVar11 = Js::FunctionCodeGenJitTimeData::GetEntryPointInfo
                      ((FunctionCodeGenJitTimeData *)runtimeData_local);
  pFStack_28->entryPointInfoAddr = (long)pEVar11;
  pFVar12 = Js::FunctionCodeGenJitTimeData::GetFunctionBody
                      ((FunctionCodeGenJitTimeData *)runtimeData_local);
  if (pFVar12 != (FunctionBody *)0x0) {
    pFVar12 = Js::FunctionCodeGenJitTimeData::GetFunctionBody
                        ((FunctionCodeGenJitTimeData *)runtimeData_local);
    pBVar13 = Js::FunctionBody::GetByteCode(pFVar12);
    if (pBVar13 != (ByteBlock *)0x0) {
      pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo
                         ((FunctionCodeGenJitTimeData *)runtimeData_local);
      this = Js::FunctionInfo::GetParseableFunctionInfo(pFVar8);
      local_38 = Js::FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
      pFVar2 = codeGenData_local;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&FunctionBodyDataIDL::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                 ,0x28);
      pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )pFVar2,&local_60);
      targetRuntimeData = (FunctionCodeGenRuntimeData *)Memory::ArenaAllocator::AllocZero;
      local_68 = 0;
      pFVar16 = (FunctionBodyDataIDL *)
                new<Memory::ArenaAllocator>(0x1b8,(ArenaAllocator *)pAVar15,0x3fb100);
      pFStack_28->bodyData = pFVar16;
      JITTimeFunctionBody::InitializeJITFunctionData
                ((ArenaAllocator *)codeGenData_local,local_38,pFStack_28->bodyData);
      if ((bool)(body._7_1_ & 1) != (jitData_local != (FunctionJITTimeDataIDL *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar14 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                           ,0x2b,"(isInlinee == !!runtimeData)","isInlinee == !!runtimeData");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar14 = 0;
      }
      pFVar20 = jitData_local;
      functionBody = (FunctionBody *)0x0;
      if (jitData_local != (FunctionJITTimeDataIDL *)0x0) {
        pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo
                           ((FunctionCodeGenJitTimeData *)runtimeData_local);
        pFVar12 = Js::FunctionInfo::GetFunctionBody(pFVar8);
        functionBody = (FunctionBody *)
                       Js::FunctionCodeGenRuntimeData::GetForTarget
                                 ((FunctionCodeGenRuntimeData *)pFVar20,pFVar12);
      }
      profileData = (ProfileDataIDL *)
                    Js::FunctionCodeGenJitTimeData::GetFunctionBody
                              ((FunctionCodeGenJitTimeData *)runtimeData_local);
      bVar3 = Js::FunctionBody::HasDynamicProfileInfo((FunctionBody *)profileData);
      pFVar2 = codeGenData_local;
      if (bVar3) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_b0,(type_info *)&ProfileDataIDL::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                   ,0x35);
        pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pFVar2,&local_b0);
        defaultEntryPointInfo = (ProxyEntryPointInfo *)Memory::ArenaAllocator::Alloc;
        local_b8 = 0;
        local_88 = (ProfileDataIDL *)
                   new<Memory::ArenaAllocator>(0xb0,(ArenaAllocator *)pAVar15,0x3f67b0);
        pFVar2 = codeGenData_local;
        profileInfo = Js::FunctionBody::GetAnyDynamicProfileInfo((FunctionBody *)profileData);
        JITTimeProfileInfo::InitializeJITProfileData
                  ((ArenaAllocator *)pFVar2,profileInfo,(FunctionBody *)profileData,local_88,
                   (bool)(body._6_1_ & 1));
        pFStack_28->bodyData->profileData = local_88;
        if ((body._7_1_ & 1) != 0) {
          functionEntryPointInfo =
               (FunctionEntryPointInfo *)
               Js::FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)profileData);
          uVar5 = (*(functionEntryPointInfo->super_EntryPointInfo).super_ProxyEntryPointInfo.
                    super_ExpirableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[8])();
          if ((uVar5 & 1) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar14 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                               ,0x3f,"(defaultEntryPointInfo->IsFunctionEntryPointInfo())",
                               "defaultEntryPointInfo->IsFunctionEntryPointInfo()");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar14 = 0;
          }
          local_d0 = functionEntryPointInfo;
          pFStack_28->callsCountAddress = (long)&functionEntryPointInfo->callsCount;
          ppiVar17 = Memory::WriteBarrierPtr::operator_cast_to_int__
                               ((WriteBarrierPtr *)&runtimeData_local[2].ldFldInlinees);
          pFStack_28->sharedPropertyGuards = *ppiVar17;
          pFStack_28->sharedPropGuardCount = *(uint *)&runtimeData_local[2].callbackInlinees.ptr;
        }
      }
      pFVar2 = codeGenData_local;
      if (pFStack_28->bodyData->profiledCallSiteCount != 0) {
        pFStack_28->inlineeCount = (uint)pFStack_28->bodyData->profiledCallSiteCount;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_f8,(type_info *)&FunctionJITTimeDataIDL*::typeinfo,0,
                   (ulong)pFStack_28->bodyData->profiledCallSiteCount,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                   ,0x4b);
        pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pFVar2,&local_f8);
        local_108 = Memory::ArenaAllocator::AllocZero;
        local_100 = 0;
        ppFVar18 = Memory::AllocateArray<Memory::ArenaAllocator,FunctionJITTimeDataIDL*,false>
                             ((Memory *)pAVar15,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,
                              0,(ulong)pFStack_28->bodyData->profiledCallSiteCount);
        pFVar2 = codeGenData_local;
        pFStack_28->inlinees = ppFVar18;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_130,(type_info *)&unsigned_char::typeinfo,0,
                   (ulong)pFStack_28->bodyData->profiledCallSiteCount,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                   ,0x4c);
        pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pFVar2,&local_130);
        pcStack_140 = Memory::ArenaAllocator::AllocZero;
        local_138 = 0;
        puVar19 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_char,false>
                            ((Memory *)pAVar15,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0
                             ,(ulong)pFStack_28->bodyData->profiledCallSiteCount);
        pFStack_28->inlineesRecursionFlags = puVar19;
        for (inlineeJITData._6_2_ = 0; pFVar2 = codeGenData_local,
            inlineeJITData._6_2_ < pFStack_28->bodyData->profiledCallSiteCount;
            inlineeJITData._6_2_ = inlineeJITData._6_2_ + 1) {
          inlineeRuntimeData =
               (FunctionCodeGenRuntimeData *)
               Js::FunctionCodeGenJitTimeData::GetInlinee
                         ((FunctionCodeGenJitTimeData *)runtimeData_local,inlineeJITData._6_2_);
          if (inlineeRuntimeData == runtimeData_local) {
            pFStack_28->inlineesRecursionFlags[inlineeJITData._6_2_] = '\x01';
          }
          else if ((FunctionCodeGenJitTimeData *)inlineeRuntimeData !=
                   (FunctionCodeGenJitTimeData *)0x0) {
            local_158 = (FunctionCodeGenRuntimeData *)0x0;
            pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo
                               ((FunctionCodeGenJitTimeData *)inlineeRuntimeData);
            BVar6 = Js::FunctionInfo::HasBody(pFVar8);
            if (BVar6 != 0) {
              if ((body._7_1_ & 1) == 0) {
                local_480 = Js::FunctionBody::GetInlineeCodeGenRuntimeData
                                      ((FunctionBody *)profileData,inlineeJITData._6_2_);
              }
              else {
                local_480 = Js::FunctionCodeGenRuntimeData::GetInlinee
                                      ((FunctionCodeGenRuntimeData *)functionBody,
                                       inlineeJITData._6_2_);
              }
              local_158 = local_480;
            }
            pFVar2 = codeGenData_local;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_180,(type_info *)&FunctionJITTimeDataIDL::typeinfo,0,
                       0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                       ,0x5c);
            pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                      *)pFVar2,&local_180);
            local_190 = Memory::ArenaAllocator::AllocZero;
            local_188 = 0;
            pFVar20 = (FunctionJITTimeDataIDL *)
                      new<Memory::ArenaAllocator>(0xa8,(ArenaAllocator *)pAVar15,0x3fb100);
            pFStack_28->inlinees[inlineeJITData._6_2_] = pFVar20;
            BuildJITTimeData((ArenaAllocator *)codeGenData_local,
                             (FunctionCodeGenJitTimeData *)inlineeRuntimeData,local_158,
                             pFStack_28->inlinees[inlineeJITData._6_2_],true,(bool)(body._6_1_ & 1))
            ;
          }
        }
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_1b8,(type_info *)&FunctionJITTimeDataIDL*::typeinfo,0,
                   (ulong)pFStack_28->bodyData->profiledCallSiteCount,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                   ,0x61);
        pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pFVar2,&local_1b8);
        pcStack_1c8 = Memory::ArenaAllocator::AllocZero;
        local_1c0 = 0;
        ppFVar18 = Memory::AllocateArray<Memory::ArenaAllocator,FunctionJITTimeDataIDL*,false>
                             ((Memory *)pAVar15,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,
                              0,(ulong)pFStack_28->bodyData->profiledCallSiteCount);
        pFStack_28->callbackInlinees = ppFVar18;
        for (inlineeJITData_1._6_2_ = 0; pFVar2 = codeGenData_local,
            inlineeJITData_1._6_2_ < pFStack_28->bodyData->profiledCallSiteCount;
            inlineeJITData_1._6_2_ = inlineeJITData_1._6_2_ + 1) {
          inlineeRuntimeData_1 =
               (FunctionCodeGenRuntimeData *)
               Js::FunctionCodeGenJitTimeData::GetCallbackInlinee
                         ((FunctionCodeGenJitTimeData *)runtimeData_local,inlineeJITData_1._6_2_);
          if ((FunctionCodeGenJitTimeData *)inlineeRuntimeData_1 !=
              (FunctionCodeGenJitTimeData *)0x0) {
            local_1e0 = (FunctionCodeGenRuntimeData *)0x0;
            pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo
                               ((FunctionCodeGenJitTimeData *)inlineeRuntimeData_1);
            BVar6 = Js::FunctionInfo::HasBody(pFVar8);
            if (BVar6 != 0) {
              if ((body._7_1_ & 1) == 0) {
                local_4a8 = Js::FunctionBody::GetCallbackInlineeCodeGenRuntimeData
                                      ((FunctionBody *)profileData,inlineeJITData_1._6_2_);
              }
              else {
                local_4a8 = Js::FunctionCodeGenRuntimeData::GetCallbackInlinee
                                      ((FunctionCodeGenRuntimeData *)functionBody,
                                       inlineeJITData_1._6_2_);
              }
              local_1e0 = local_4a8;
            }
            pFVar2 = codeGenData_local;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_208,(type_info *)&FunctionJITTimeDataIDL::typeinfo,0,
                       0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                       ,0x6d);
            pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                      *)pFVar2,&local_208);
            local_218 = Memory::ArenaAllocator::AllocZero;
            local_210 = 0;
            pFVar20 = (FunctionJITTimeDataIDL *)
                      new<Memory::ArenaAllocator>(0xa8,(ArenaAllocator *)pAVar15,0x3fb100);
            pFStack_28->callbackInlinees[inlineeJITData_1._6_2_] = pFVar20;
            BuildJITTimeData((ArenaAllocator *)codeGenData_local,
                             (FunctionCodeGenJitTimeData *)inlineeRuntimeData_1,local_1e0,
                             pFStack_28->callbackInlinees[inlineeJITData_1._6_2_],true,
                             (bool)(body._6_1_ & 1));
          }
        }
        pFStack_28->callApplyTargetInlineeCount =
             (uint)pFStack_28->bodyData->profiledCallApplyCallSiteCount;
        if (pFStack_28->bodyData->profiledCallApplyCallSiteCount != 0) {
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_240,(type_info *)&FunctionJITTimeDataIDL*::typeinfo,0,
                     (ulong)pFStack_28->bodyData->profiledCallApplyCallSiteCount,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                     ,0x75);
          pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                    TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    *)pFVar2,&local_240);
          pcStack_250 = Memory::ArenaAllocator::AllocZero;
          local_248 = 0;
          ppFVar18 = Memory::AllocateArray<Memory::ArenaAllocator,FunctionJITTimeDataIDL*,false>
                               ((Memory *)pAVar15,
                                (ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                                (ulong)pFStack_28->bodyData->profiledCallApplyCallSiteCount);
          pFStack_28->callApplyTargetInlinees = ppFVar18;
        }
        for (inlineeJITData_2._6_2_ = 0;
            inlineeJITData_2._6_2_ < pFStack_28->bodyData->profiledCallApplyCallSiteCount;
            inlineeJITData_2._6_2_ = inlineeJITData_2._6_2_ + 1) {
          inlineeRuntimeData_2 =
               (FunctionCodeGenRuntimeData *)
               Js::FunctionCodeGenJitTimeData::GetCallApplyTargetInlinee
                         ((FunctionCodeGenJitTimeData *)runtimeData_local,inlineeJITData_2._6_2_);
          if ((FunctionCodeGenJitTimeData *)inlineeRuntimeData_2 !=
              (FunctionCodeGenJitTimeData *)0x0) {
            local_268 = (FunctionCodeGenRuntimeData *)0x0;
            pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo
                               ((FunctionCodeGenJitTimeData *)inlineeRuntimeData_2);
            BVar6 = Js::FunctionInfo::HasBody(pFVar8);
            if (BVar6 != 0) {
              if ((body._7_1_ & 1) == 0) {
                local_4d0 = Js::FunctionBody::GetCallApplyTargetInlineeCodeGenRuntimeData
                                      ((FunctionBody *)profileData,inlineeJITData_2._6_2_);
              }
              else {
                local_4d0 = Js::FunctionCodeGenRuntimeData::GetCallApplyTargetInlinee
                                      ((FunctionCodeGenRuntimeData *)functionBody,
                                       inlineeJITData_2._6_2_);
              }
              local_268 = local_4d0;
            }
            pFVar2 = codeGenData_local;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_290,(type_info *)&FunctionJITTimeDataIDL::typeinfo,0,
                       0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                       ,0x81);
            pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                      *)pFVar2,&local_290);
            local_2a0 = Memory::ArenaAllocator::AllocZero;
            local_298 = 0;
            pFVar20 = (FunctionJITTimeDataIDL *)
                      new<Memory::ArenaAllocator>(0xa8,(ArenaAllocator *)pAVar15,0x3fb100);
            pFStack_28->callApplyTargetInlinees[inlineeJITData_2._6_2_] = pFVar20;
            BuildJITTimeData((ArenaAllocator *)codeGenData_local,
                             (FunctionCodeGenJitTimeData *)inlineeRuntimeData_2,local_268,
                             pFStack_28->callApplyTargetInlinees[inlineeJITData_2._6_2_],true,
                             (bool)(body._6_1_ & 1));
          }
        }
      }
      pFVar2 = codeGenData_local;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_2c8,(type_info *)&FunctionJITRuntimeIDL::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                 ,0x86);
      pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )pFVar2,&local_2c8);
      local_2d8 = Memory::ArenaAllocator::AllocZero;
      local_2d0 = 0;
      pFVar21 = (FunctionJITRuntimeIDL *)
                new<Memory::ArenaAllocator>(0x10,(ArenaAllocator *)pAVar15,0x3fb100);
      pFStack_28->profiledRuntimeData = pFVar21;
      if ((body._7_1_ & 1) != 0) {
        pIVar22 = Js::FunctionCodeGenRuntimeData::ClonedInlineCaches
                            ((FunctionCodeGenRuntimeData *)functionBody);
        bVar3 = Js::InlineCachePointerArray<Js::InlineCache>::HasInlineCaches(pIVar22);
        pFVar2 = codeGenData_local;
        if (bVar3) {
          pFStack_28->profiledRuntimeData->clonedCacheCount = pFStack_28->bodyData->inlineCacheCount
          ;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_300,(type_info *)&long::typeinfo,0,
                     (ulong)pFStack_28->profiledRuntimeData->clonedCacheCount,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                     ,0x8a);
          pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                    TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    *)pFVar2,&local_300);
          pcStack_310 = Memory::ArenaAllocator::Alloc;
          local_308 = 0;
          plVar23 = Memory::AllocateArray<Memory::ArenaAllocator,long,false>
                              ((Memory *)pAVar15,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                               (ulong)pFStack_28->profiledRuntimeData->clonedCacheCount);
          pFStack_28->profiledRuntimeData->clonedInlineCaches = plVar23;
          for (local_314 = 0; local_314 < pFStack_28->bodyData->inlineCacheCount;
              local_314 = local_314 + 1) {
            pIVar22 = Js::FunctionCodeGenRuntimeData::ClonedInlineCaches
                                ((FunctionCodeGenRuntimeData *)functionBody);
            pIVar24 = Js::InlineCachePointerArray<Js::InlineCache>::GetInlineCache
                                (pIVar22,local_314);
            pFStack_28->profiledRuntimeData->clonedInlineCaches[local_314] = (long)pIVar24;
          }
        }
      }
      pFVar2 = codeGenData_local;
      if (pFStack_28->bodyData->inlineCacheCount != 0) {
        pFStack_28->ldFldInlineeCount = pFStack_28->bodyData->inlineCacheCount;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_340,(type_info *)&FunctionJITTimeDataIDL*::typeinfo,0,
                   (ulong)pFStack_28->bodyData->inlineCacheCount,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                   ,0x93);
        pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pFVar2,&local_340);
        objTypeSpecInfo = (Type *)Memory::ArenaAllocator::AllocZero;
        local_348 = 0;
        ppFVar18 = Memory::AllocateArray<Memory::ArenaAllocator,FunctionJITTimeDataIDL*,false>
                             ((Memory *)pAVar15,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,
                              0,(ulong)pFStack_28->bodyData->inlineCacheCount);
        pFStack_28->ldFldInlinees = ppFVar18;
        this_00 = Js::FunctionCodeGenJitTimeData::GetObjTypeSpecFldInfoArray
                            ((FunctionCodeGenJitTimeData *)runtimeData_local);
        pTStack_358 = ObjTypeSpecFldInfoArray::GetInfoArray(this_00);
        if (pTStack_358 != (Type *)0x0) {
          pFStack_28->objTypeSpecFldInfoCount = pFStack_28->bodyData->inlineCacheCount;
          ppOVar25 = unsafe_write_barrier_cast<ObjTypeSpecFldIDL**,Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>*>
                               (pTStack_358);
          pFStack_28->objTypeSpecFldInfoArray = ppOVar25;
        }
        for (inlineeJITData_3._4_4_ = 0;
            inlineeJITData_3._4_4_ < pFStack_28->bodyData->inlineCacheCount;
            inlineeJITData_3._4_4_ = inlineeJITData_3._4_4_ + 1) {
          inlineeRuntimeData_3 =
               (FunctionCodeGenRuntimeData *)
               Js::FunctionCodeGenJitTimeData::GetLdFldInlinee
                         ((FunctionCodeGenJitTimeData *)runtimeData_local,inlineeJITData_3._4_4_);
          if ((body._7_1_ & 1) == 0) {
            local_518 = Js::FunctionBody::GetLdFldInlineeCodeGenRuntimeData
                                  ((FunctionBody *)profileData,inlineeJITData_3._4_4_);
          }
          else {
            local_518 = Js::FunctionCodeGenRuntimeData::GetLdFldInlinee
                                  ((FunctionCodeGenRuntimeData *)functionBody,inlineeJITData_3._4_4_
                                  );
          }
          pFVar2 = codeGenData_local;
          local_370 = local_518;
          if (inlineeRuntimeData_3 != (FunctionCodeGenRuntimeData *)0x0) {
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_398,(type_info *)&FunctionJITTimeDataIDL::typeinfo,0,
                       0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                       ,0xa1);
            pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                      *)pFVar2,&local_398);
            globObjTypeSpecInfo = (Type *)Memory::ArenaAllocator::AllocZero;
            local_3a0 = 0;
            pFVar20 = (FunctionJITTimeDataIDL *)
                      new<Memory::ArenaAllocator>(0xa8,(ArenaAllocator *)pAVar15,0x3fb100);
            pFStack_28->ldFldInlinees[inlineeJITData_3._4_4_] = pFVar20;
            BuildJITTimeData((ArenaAllocator *)codeGenData_local,
                             (FunctionCodeGenJitTimeData *)inlineeRuntimeData_3,local_370,
                             pFStack_28->ldFldInlinees[inlineeJITData_3._4_4_],true,
                             (bool)(body._6_1_ & 1));
          }
        }
      }
      if (((body._7_1_ & 1) == 0) &&
         (uVar7 = Js::FunctionCodeGenJitTimeData::GetGlobalObjTypeSpecFldInfoCount
                            ((FunctionCodeGenJitTimeData *)runtimeData_local), uVar7 != 0)) {
        nextJITData = (FunctionCodeGenJitTimeData *)
                      Js::FunctionCodeGenJitTimeData::GetGlobalObjTypeSpecFldInfoArray
                                ((FunctionCodeGenJitTimeData *)runtimeData_local);
        if (nextJITData == (FunctionCodeGenJitTimeData *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar14 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                             ,0xa9,"(globObjTypeSpecInfo != nullptr)",
                             "globObjTypeSpecInfo != nullptr");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar14 = 0;
        }
        uVar7 = Js::FunctionCodeGenJitTimeData::GetGlobalObjTypeSpecFldInfoCount
                          ((FunctionCodeGenJitTimeData *)runtimeData_local);
        pFStack_28->globalObjTypeSpecFldInfoCount = uVar7;
        ppOVar25 = unsafe_write_barrier_cast<ObjTypeSpecFldIDL**,Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>*>
                             ((WriteBarrierPtr<ObjTypeSpecFldInfo> *)nextJITData);
        pFStack_28->globalObjTypeSpecFldInfoArray = ppOVar25;
      }
      local_3b8 = Js::FunctionCodeGenJitTimeData::GetNext
                            ((FunctionCodeGenJitTimeData *)runtimeData_local);
      if (local_3b8 == (FunctionCodeGenJitTimeData *)0x0) {
        return;
      }
      if ((body._7_1_ & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar14 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                           ,0xb2,"(isInlinee)","isInlinee");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar14 = 0;
      }
      pFVar2 = codeGenData_local;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_3e0,(type_info *)&FunctionJITTimeDataIDL::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                 ,0xb3);
      pAVar15 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )pFVar2,&local_3e0);
      pFVar20 = (FunctionJITTimeDataIDL *)
                new<Memory::ArenaAllocator>(0xa8,(ArenaAllocator *)pAVar15,0x3fb100);
      pFStack_28->next = pFVar20;
      BuildJITTimeData((ArenaAllocator *)codeGenData_local,local_3b8,
                       (FunctionCodeGenRuntimeData *)jitData_local,pFStack_28->next,true,
                       (bool)(body._6_1_ & 1));
      return;
    }
  }
  if ((body._7_1_ & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                       ,0x23,"(isInlinee)","isInlinee");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 0;
  }
  return;
}

Assistant:

void
FunctionJITTimeInfo::BuildJITTimeData(
    __in ArenaAllocator * alloc,
    __in const Js::FunctionCodeGenJitTimeData * codeGenData,
    __in_opt const Js::FunctionCodeGenRuntimeData * runtimeData,
    __out FunctionJITTimeDataIDL * jitData,
    bool isInlinee,
    bool isForegroundJIT)
{
    jitData->functionInfoAddr = (intptr_t)codeGenData->GetFunctionInfo();
    jitData->localFuncId = codeGenData->GetFunctionInfo()->GetLocalFunctionId();
    jitData->isAggressiveInliningEnabled = codeGenData->GetIsAggressiveInliningEnabled();
    jitData->isInlined = codeGenData->GetIsInlined();
    jitData->weakFuncRef = (intptr_t)codeGenData->GetWeakFuncRef();
    jitData->inlineesBv = (BVFixedIDL*)(const BVFixed*)codeGenData->inlineesBv;
    jitData->entryPointInfoAddr = (intptr_t)codeGenData->GetEntryPointInfo();

    if (!codeGenData->GetFunctionBody() || !codeGenData->GetFunctionBody()->GetByteCode())
    {
        // outermost function must have a body, but inlinees may not (if they are builtins)
        Assert(isInlinee);
        return;
    }

    Js::FunctionBody * body = codeGenData->GetFunctionInfo()->GetParseableFunctionInfo()->GetFunctionBody();
    jitData->bodyData = AnewStructZ(alloc, FunctionBodyDataIDL);
    JITTimeFunctionBody::InitializeJITFunctionData(alloc, body, jitData->bodyData);

    Assert(isInlinee == !!runtimeData);
    const Js::FunctionCodeGenRuntimeData * targetRuntimeData = nullptr;
    if (runtimeData)
    {
        // may be polymorphic, so seek the runtime data matching our JIT time data
        targetRuntimeData = runtimeData->GetForTarget(codeGenData->GetFunctionInfo()->GetFunctionBody());
    }
    Js::FunctionBody * functionBody = codeGenData->GetFunctionBody();
    if (functionBody->HasDynamicProfileInfo())
    {
        ProfileDataIDL * profileData = AnewStruct(alloc, ProfileDataIDL);
        JITTimeProfileInfo::InitializeJITProfileData(alloc, functionBody->GetAnyDynamicProfileInfo(), functionBody, profileData, isForegroundJIT);

        jitData->bodyData->profileData = profileData;

        if (isInlinee)
        {
            // if not inlinee, NativeCodeGenerator will provide the address
            // REVIEW: OOP JIT, for inlinees, is this actually necessary?
            Js::ProxyEntryPointInfo *defaultEntryPointInfo = functionBody->GetDefaultEntryPointInfo();
            Assert(defaultEntryPointInfo->IsFunctionEntryPointInfo());
            Js::FunctionEntryPointInfo *functionEntryPointInfo = static_cast<Js::FunctionEntryPointInfo*>(defaultEntryPointInfo);
            jitData->callsCountAddress = (intptr_t)&functionEntryPointInfo->callsCount;

            jitData->sharedPropertyGuards = codeGenData->sharedPropertyGuards;
            jitData->sharedPropGuardCount = codeGenData->sharedPropertyGuardCount;
        }
    }
    if (jitData->bodyData->profiledCallSiteCount > 0)
    {
        jitData->inlineeCount = jitData->bodyData->profiledCallSiteCount;
        // using arena because we can't recycler allocate (may be on background), and heap freeing this is slightly complicated
        jitData->inlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->profiledCallSiteCount);
        jitData->inlineesRecursionFlags = AnewArrayZ(alloc, boolean, jitData->bodyData->profiledCallSiteCount);

        for (Js::ProfileId i = 0; i < jitData->bodyData->profiledCallSiteCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetInlinee(i);
            if (inlineeJITData == codeGenData)
            {
                jitData->inlineesRecursionFlags[i] = TRUE;
            }
            else if (inlineeJITData != nullptr)
            {
                const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = nullptr;
                if (inlineeJITData->GetFunctionInfo()->HasBody())
                {
                    inlineeRuntimeData = isInlinee ? targetRuntimeData->GetInlinee(i) : functionBody->GetInlineeCodeGenRuntimeData(i);
                }
                jitData->inlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->inlinees[i], true, isForegroundJIT);
            }
        }

        jitData->callbackInlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->profiledCallSiteCount);

        for (Js::ProfileId i = 0; i < jitData->bodyData->profiledCallSiteCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetCallbackInlinee(i);
            if (inlineeJITData != nullptr)
            {
                const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = nullptr;
                if (inlineeJITData->GetFunctionInfo()->HasBody())
                {
                    inlineeRuntimeData = isInlinee ? targetRuntimeData->GetCallbackInlinee(i) : functionBody->GetCallbackInlineeCodeGenRuntimeData(i);
                }
                jitData->callbackInlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->callbackInlinees[i], true, isForegroundJIT);
            }
        }

        jitData->callApplyTargetInlineeCount = jitData->bodyData->profiledCallApplyCallSiteCount;
        if (jitData->bodyData->profiledCallApplyCallSiteCount > 0)
        {
            jitData->callApplyTargetInlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->profiledCallApplyCallSiteCount);
        }
        for (Js::ProfileId i = 0; i < jitData->bodyData->profiledCallApplyCallSiteCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetCallApplyTargetInlinee(i);
            if (inlineeJITData != nullptr)
            {
                const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = nullptr;
                if (inlineeJITData->GetFunctionInfo()->HasBody())
                {
                    inlineeRuntimeData = isInlinee ? targetRuntimeData->GetCallApplyTargetInlinee(i) : functionBody->GetCallApplyTargetInlineeCodeGenRuntimeData(i);
                }
                jitData->callApplyTargetInlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->callApplyTargetInlinees[i], true, isForegroundJIT);
            }
        }
    }
    jitData->profiledRuntimeData = AnewStructZ(alloc, FunctionJITRuntimeIDL);
    if (isInlinee && targetRuntimeData->ClonedInlineCaches()->HasInlineCaches())
    {
        jitData->profiledRuntimeData->clonedCacheCount = jitData->bodyData->inlineCacheCount;
        jitData->profiledRuntimeData->clonedInlineCaches = AnewArray(alloc, intptr_t, jitData->profiledRuntimeData->clonedCacheCount);
        for (uint j = 0; j < jitData->bodyData->inlineCacheCount; ++j)
        {
            jitData->profiledRuntimeData->clonedInlineCaches[j] = (intptr_t)targetRuntimeData->ClonedInlineCaches()->GetInlineCache(j);
        }
    }
    if (jitData->bodyData->inlineCacheCount > 0)
    {
        jitData->ldFldInlineeCount = jitData->bodyData->inlineCacheCount;
        jitData->ldFldInlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->inlineCacheCount);

        Field(ObjTypeSpecFldInfo*)* objTypeSpecInfo = codeGenData->GetObjTypeSpecFldInfoArray()->GetInfoArray();
        if(objTypeSpecInfo)
        {
            jitData->objTypeSpecFldInfoCount = jitData->bodyData->inlineCacheCount;
            jitData->objTypeSpecFldInfoArray = unsafe_write_barrier_cast<ObjTypeSpecFldIDL**>(objTypeSpecInfo);
        }
        for (Js::InlineCacheIndex i = 0; i < jitData->bodyData->inlineCacheCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetLdFldInlinee(i);
            const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = isInlinee ? targetRuntimeData->GetLdFldInlinee(i) : functionBody->GetLdFldInlineeCodeGenRuntimeData(i);
            if (inlineeJITData != nullptr)
            {
                jitData->ldFldInlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->ldFldInlinees[i], true, isForegroundJIT);
            }
        }
    }
    if (!isInlinee && codeGenData->GetGlobalObjTypeSpecFldInfoCount() > 0)
    {
        Field(ObjTypeSpecFldInfo*)* globObjTypeSpecInfo = codeGenData->GetGlobalObjTypeSpecFldInfoArray();
        Assert(globObjTypeSpecInfo != nullptr);

        jitData->globalObjTypeSpecFldInfoCount = codeGenData->GetGlobalObjTypeSpecFldInfoCount();
        jitData->globalObjTypeSpecFldInfoArray = unsafe_write_barrier_cast<ObjTypeSpecFldIDL**>(globObjTypeSpecInfo);
    }
    const Js::FunctionCodeGenJitTimeData * nextJITData = codeGenData->GetNext();
    if (nextJITData != nullptr)
    {
        // only inlinee should be polymorphic
        Assert(isInlinee);
        jitData->next = AnewStructZ(alloc, FunctionJITTimeDataIDL);
        BuildJITTimeData(alloc, nextJITData, runtimeData, jitData->next, true, isForegroundJIT);
    }
}